

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelRequest.h
# Opt level: O1

void __thiscall
FIX41::OrderCancelRequest::OrderCancelRequest
          (OrderCancelRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,Symbol *aSymbol,
          Side *aSide)

{
  FieldBase FStack_88;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&FStack_88);
  FIX::FieldBase::~FieldBase(&FStack_88);
  *(undefined ***)&this->super_Message = &PTR__Message_001622f8;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrigClOrdID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aClOrdID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSymbol,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  return;
}

Assistant:

OrderCancelRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aSymbol);
      set(aSide);
    }